

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gccode.c
# Opt level: O0

LispPTR map_code_pointers(LispPTR codeblock,short casep)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  LispPTR *pLVar4;
  char local_f8 [8];
  char errtext [200];
  LispPTR reclaimed;
  fnhead *fnbase;
  uint len;
  uint opnum;
  InstPtr codeptr;
  short casep_local;
  LispPTR codeblock_local;
  
  pLVar4 = NativeAligned4FromLAddr(codeblock);
  _len = (long)pLVar4 + (long)(int)(uint)(ushort)pLVar4[1];
  while( true ) {
    bVar1 = *(byte *)(_len ^ 3);
    uVar2 = (uint)bVar1;
    if (bVar1 == 0) break;
    if (bVar1 == 0x6f) {
      uVar3 = (uint)*(byte *)(_len + 1 ^ 3) << 0x18 | (uint)*(byte *)(_len + 2 ^ 3) << 0x10 |
              (uint)*(byte *)(_len + 3 ^ 3) << 8;
      errtext._196_4_ = uVar3 | *(byte *)(_len + 4 ^ 3);
      if (((errtext._196_4_ != codeblock) &&
          ((*(ushort *)((ulong)(MDStypetbl + (uVar3 >> 9)) ^ 2) & 0x8000) == 0)) &&
         (*GcDisabled_word != 0x4c)) {
        rec_htfind(errtext._196_4_,(int)casep);
      }
    }
    fnbase._0_4_ = oplength[uVar2];
    if (5 < (uint)fnbase) {
      sprintf(local_f8,
              "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use UFN length"
              ,(ulong)uVar2,_len - (long)pLVar4,(ulong)(codeblock >> 0x10 & 0xff),
              (ulong)(codeblock & 0xffff));
      error(local_f8);
      fnbase._0_4_ = (uint)(UFNTable[(ulong)uVar2 * 2] >> 8);
      oplength[uVar2] = (uint)fnbase;
    }
    _len = _len + ((uint)fnbase + 1);
  }
  return 0;
}

Assistant:

static LispPTR map_code_pointers(LispPTR codeblock, short int casep) {
  InstPtr codeptr;
  unsigned int opnum;
  unsigned int len;
  struct fnhead *fnbase;
  fnbase = (struct fnhead *)NativeAligned4FromLAddr(codeblock);
  codeptr = ((InstPtr)fnbase) + fnbase->startpc;

#ifdef RESWAPPEDCODESTREAM
  if (!fnbase->byteswapped) byte_swap_code_block(fnbase);
#endif

  while (T) {
    switch (opnum = Get_code_BYTE(codeptr)) {
      case ENDOFX: /* -X- */ return (NIL);
      case GCONST: /* GCONST */
#ifdef BIGVM
      {
        LispPTR reclaimed = (Get_code_BYTE(codeptr + 1) << 24) |
                            (Get_code_BYTE(codeptr + 2) << 16) | (Get_code_BYTE(codeptr + 3) << 8) |
                            Get_code_BYTE(codeptr + 4);
#else
      {
        LispPTR reclaimed = (Get_code_BYTE(codeptr + 1) << 16) | (Get_code_BYTE(codeptr + 2) << 8) |
                            Get_code_BYTE(codeptr + 3);
#endif /* BIGVM */
        if (reclaimed != codeblock)
        /*			      {htfind(reclaimed, casep);} */
        {
          REC_GCLOOKUP(reclaimed, casep);
        }
      }
    }
    if ((len = oplength[opnum]) >
        LONGEST_OPCODE) { /* len > biggest possible marks an unknown opcode */
      char errtext[200];
      sprintf(errtext,
              "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use "
              "UFN length",
              opnum, codeptr - (InstPtr)fnbase, (codeblock >> 16) & 0xFF, codeblock & 0xFFFF);
      error(errtext);
      oplength[opnum] = len = (((UFN *)UFNTable) + (opnum))->byte_num;
    }
    codeptr += len + 1;
  }
}

/************************************************************************/
/*									*/
/*		    r e m i m p l i c i t k e y h a s h			*/
/*									*/
/*	Remove a fn defn from the implicit-key hash table of defns	*/
/*									*/
/************************************************************************/

/* JRB - These values are xpointers; their high bytes are not set and
        shouldn't be looked at */
#define getikkey(value) ((*(LispPTR *)NativeAligned4FromLAddr(value)) & POINTERMASK)

static LispPTR remimplicitkeyhash(LispPTR item, LispPTR ik_hash_table) {
  Ikhashtbl *ik_htable;
  LispPTR reprobe, bits, limits, index, base, value;
  ik_htable = (Ikhashtbl *)NativeAligned4FromLAddr(ik_hash_table);
  bits = Hashingbits(item);
  limits = ik_htable->last_index;
  index = (bits & limits);
  base = ik_htable->base;
  value = Getikvalue(base, index);
  if (value != *Deleted_Implicit_Hash_Slot_word) {
    if (value != NIL) {
      if (item == getikkey(value)) { goto found; }
    } else
      return (NIL);
  }
  reprobe = Reprobefn(bits, limits);
lp:
  index = Fn16bits(index, reprobe) & limits;
  value = Getikvalue(base, index);
  if (value != *Deleted_Implicit_Hash_Slot_word) {
    if (value != NIL) {
      if (item == getikkey(value)) { goto found; }
    } else
      return (NIL);
  }
  goto lp;
found:
  /*
      htfind(*Deleted_Implicit_Hash_Slot_word, ADDREF);
      htfind(Getikvalue(base, index), DELREF);
  */
  REC_GCLOOKUP(*Deleted_Implicit_Hash_Slot_word, ADDREF);
  REC_GCLOOKUP(Getikvalue(base, index), DELREF);
  Getikvalue(base, index) = *Deleted_Implicit_Hash_Slot_word;
  (ik_htable->num_keys)--;
  return (T);
}

/************************************************************************/
/*									*/
/*		    r e c l a i m c o d e b l o c k			*/
/*									*/
/*	Reclaim an array block that contains compiled code.  When	*/
/*	this happens, we need to decrement the reference counts for	*/
/*									*/
/*		* The frame name, which may be a string, list, etc.	*/
/*		* Any GCONSTs in the code (constants, internal fns,	*/
/*		  etc.), since they're no longer needed.		*/
/*									*/
/************************************************************************/

LispPTR reclaimcodeblock(LispPTR codebase) {
  struct fnhead *fnbase;
  if ((*Closure_Cache_Enabled_word != NIL) &&
      (remimplicitkeyhash(codebase, *Closure_Cache_word) != NIL)) {
    return (T);
  }
  fnbase = (struct fnhead *)NativeAligned4FromLAddr(codebase);
  REC_GCLOOKUP((POINTERMASK & fnbase->framename), DELREF);
  if (fnbase->startpc != 0) map_code_pointers(codebase, DELREF);
  return (NIL);
}

/************************************************************************/
/*									*/
/*		    c o d e _ b l o c k _ s i z e			*/
/*									*/
/*	Given a native pointer to a code block, return its size.	*/
/*									*/
/************************************************************************/

int code_block_size(long unsigned int codeblock68k) {
  InstPtr codeptr, initcodeptr;
  unsigned int opnum;
  unsigned int len;
  struct fnhead *fnbase;
  fnbase = (struct fnhead *)codeblock68k;
  initcodeptr = codeptr = ((InstPtr)fnbase) + fnbase->startpc;
  while (T) {
    switch (opnum = Get_BYTE(codeptr)) {
      case ENDOFX: /* -X- */ return (codeptr - initcodeptr);
    }
    if ((len = oplength[opnum]) >
        LONGEST_OPCODE) { /* len > biggest possible marks an unknown opcode */
      char errtext[200];
      sprintf(errtext,
              "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use "
              "UFN length",
              opnum, codeptr - (InstPtr)fnbase, (int)((codeblock68k >> 16) & 0xFF), (int)(codeblock68k & 0xFFFF));
      error(errtext);
      oplength[opnum] = len = (((UFN *)UFNTable) + (opnum))->byte_num;
    }
    codeptr += len + 1;
  }
}